

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool __thiscall cmDependsFortran::FindModule(cmDependsFortran *this,string *name,string *module)

{
  bool bVar1;
  pointer pbVar2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string mod_lower;
  string mod_upper;
  string fullName;
  string local_120;
  string local_100;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  undefined8 local_d0;
  undefined1 *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  string local_b0;
  string *local_90;
  pointer local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  cmFortranModuleAppendUpperLower(name,&local_100,&local_120);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pbVar2 = (this->super_cmDepends).IncludePath.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->super_cmDepends).IncludePath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = pbVar2 != local_88;
  if (bVar3) {
    local_90 = module;
    do {
      local_e0._M_str = (pbVar2->_M_dataplus)._M_p;
      local_e0._M_len = pbVar2->_M_string_length;
      local_60 = 1;
      local_50[0] = 0x2f;
      local_d0 = 1;
      local_c0 = local_120._M_string_length;
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_120._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = &local_e0;
      local_c8 = local_50;
      local_58 = local_50;
      cmCatViews_abi_cxx11_(&local_80,views);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar1 = cmsys::SystemTools::FileExists(&local_b0,true);
      if (bVar1) {
LAB_004f0378:
        std::__cxx11::string::_M_assign((string *)local_90);
        break;
      }
      local_e0._M_str = (pbVar2->_M_dataplus)._M_p;
      local_e0._M_len = pbVar2->_M_string_length;
      local_60 = 1;
      local_50[0] = 0x2f;
      local_d0 = 1;
      local_c0 = local_100._M_string_length;
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_100._M_dataplus._M_p;
      views_00._M_len = 3;
      views_00._M_array = &local_e0;
      local_c8 = local_50;
      local_58 = local_50;
      cmCatViews_abi_cxx11_(&local_80,views_00);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar1 = cmsys::SystemTools::FileExists(&local_b0,true);
      if (bVar1) goto LAB_004f0378;
      pbVar2 = pbVar2 + 1;
      bVar3 = pbVar2 != local_88;
    } while (bVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool cmDependsFortran::FindModule(std::string const& name, std::string& module)
{
  // Construct possible names for the module file.
  std::string mod_upper;
  std::string mod_lower;
  cmFortranModuleAppendUpperLower(name, mod_upper, mod_lower);

  // Search the include path for the module.
  std::string fullName;
  for (std::string const& ip : this->IncludePath) {
    // Try the lower-case name.
    fullName = cmStrCat(ip, '/', mod_lower);
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }

    // Try the upper-case name.
    fullName = cmStrCat(ip, '/', mod_upper);
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }
  }
  return false;
}